

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::cni_holder<cs::numeric_&(*)(cs::numeric_&),_cs::numeric_&(*)(cs::numeric_&)>::cni_holder
          (cni_holder<cs::numeric_&(*)(cs::numeric_&),_cs::numeric_&(*)(cs::numeric_&)> *this,
          _func_numeric_ptr_numeric_ptr **func)

{
  function<cs::numeric_&(cs::numeric_&)> *in_RDI;
  cni_helper<cs::numeric_&(*)(cs::numeric_&),_cs::numeric_&(*)(cs::numeric_&)> *this_00;
  function<cs::numeric_&(cs::numeric_&)> *in_stack_ffffffffffffffc0;
  _func_numeric_ptr_numeric_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006c4660;
  this_00 = (cni_helper<cs::numeric_&(*)(cs::numeric_&),_cs::numeric_&(*)(cs::numeric_&)> *)
            ((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<cs::numeric&(cs::numeric&)>::function<cs::numeric&(*const&)(cs::numeric&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<cs::numeric_&(*)(cs::numeric_&),_cs::numeric_&(*)(cs::numeric_&)>::cni_helper
            (this_00,in_RDI);
  std::function<cs::numeric_&(cs::numeric_&)>::~function
            ((function<cs::numeric_&(cs::numeric_&)> *)0x48e946);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}